

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O2

void __thiscall
crn::corpus_tester::print_comparative_metric_stats
          (corpus_tester *this,command_line_params *cmd_line_params,
          vector<crnlib::image_utils::error_metrics> *stats1,
          vector<crnlib::image_utils::error_metrics> *stats2,uint num_blocks_x,uint num_blocks_y)

{
  double dVar1;
  double dVar2;
  error_metrics *peVar3;
  error_metrics *peVar4;
  bool bVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  long lVar9;
  vector<unsigned_int> *this_00;
  uint i;
  ulong uVar10;
  vector<unsigned_int> worse_blocks;
  float local_8c;
  vector<unsigned_int> equal_blocks;
  vector<unsigned_int> better_blocks;
  vector<float> delta_psnr;
  vector<unsigned_int> indices [2];
  
  better_blocks.m_p = (uint *)0x0;
  better_blocks.m_size = 0;
  better_blocks.m_capacity = 0;
  equal_blocks.m_p = (uint *)0x0;
  equal_blocks.m_size = 0;
  equal_blocks.m_capacity = 0;
  worse_blocks.m_p = (uint *)0x0;
  worse_blocks.m_size = 0;
  worse_blocks.m_capacity = 0;
  delta_psnr.m_p = (float *)0x0;
  delta_psnr.m_size = 0;
  delta_psnr.m_capacity = 0;
  uVar6 = 0;
  while( true ) {
    indices[0].m_p = (uint *)CONCAT44(indices[0].m_p._4_4_,uVar6);
    if (stats1->m_size <= uVar6) break;
    peVar3 = stats1->m_p;
    peVar4 = stats2->m_p;
    dVar1 = peVar3[uVar6].mPeakSNR;
    dVar2 = peVar4[uVar6].mPeakSNR;
    if (dVar2 <= dVar1) {
      this_00 = &equal_blocks;
      if (0.0010000000474974513 <= ABS(dVar1 - dVar2)) {
        this_00 = &better_blocks;
      }
      crnlib::vector<unsigned_int>::push_back(this_00,(uint *)indices);
    }
    else {
      crnlib::vector<unsigned_int>::push_back(&worse_blocks,(uint *)indices);
      local_8c = (float)(peVar4[uVar6].mPeakSNR - peVar3[uVar6].mPeakSNR);
      crnlib::vector<float>::push_back(&delta_psnr,&local_8c);
    }
    uVar6 = (int)indices[0].m_p + 1;
  }
  crnlib::console::printf
            ("Num worse blocks: %u, %3.3f%%",
             SUB84((double)(((float)(worse_blocks._8_8_ & 0xffffffff) * 100.0) /
                           (float)stats1->m_size),0));
  crnlib::console::printf
            ("Num equal blocks: %u, %3.3f%%",
             SUB84((double)(((float)(equal_blocks._8_8_ & 0xffffffff) * 100.0) /
                           (float)stats1->m_size),0));
  crnlib::console::printf
            ("Num better blocks: %u, %3.3f%%",
             SUB84((double)(((float)(better_blocks._8_8_ & 0xffffffff) * 100.0) /
                           (float)stats1->m_size),0));
  crnlib::console::printf
            ("Num equal+better blocks: %u, %3.3f%%",
             SUB84((double)(((float)(better_blocks.m_size + equal_blocks.m_size) * 100.0) /
                           (float)stats1->m_size),0));
  bVar5 = crnlib::command_line_params::has_key(cmd_line_params,"nobadblocks");
  if (!bVar5) {
    indices[1].m_p = (uint *)0x0;
    indices[1].m_size = 0;
    indices[1].m_capacity = 0;
    indices[0].m_p = (uint *)0x0;
    indices[0].m_size = 0;
    indices[0].m_capacity = 0;
    crnlib::vector<unsigned_int>::resize(indices,worse_blocks.m_size,false);
    crnlib::vector<unsigned_int>::resize(indices + 1,worse_blocks.m_size,false);
    if (worse_blocks.m_size != 0) {
      puVar7 = crnlib::indirect_radix_sort<unsigned_int,float>
                         (worse_blocks.m_size,indices[0].m_p,indices[1].m_p,delta_psnr.m_p,0,4,true)
      ;
      crnlib::console::printf("List of worse blocks sorted by delta PSNR:");
      for (uVar10 = 0; uVar10 < (worse_blocks._8_8_ & 0xffffffff); uVar10 = uVar10 + 1) {
        uVar8 = (ulong)worse_blocks.m_p[puVar7[uVar10]];
        dVar1 = stats1->m_p[uVar8].mPeakSNR;
        dVar2 = stats2->m_p[uVar8].mPeakSNR;
        crnlib::console::printf
                  ("%u. [%u,%u] %3.3f %3.3f %3.3f",SUB84(dVar1,0),dVar2,dVar2 - dVar1,
                   uVar10 & 0xffffffff,uVar8 % (ulong)num_blocks_x,uVar8 / num_blocks_x);
      }
    }
    lVar9 = 0x10;
    do {
      crnlib::vector<unsigned_int>::~vector((vector<unsigned_int> *)((long)&indices[0].m_p + lVar9))
      ;
      lVar9 = lVar9 + -0x10;
    } while (lVar9 != -0x10);
  }
  crnlib::vector<float>::~vector(&delta_psnr);
  crnlib::vector<unsigned_int>::~vector(&worse_blocks);
  crnlib::vector<unsigned_int>::~vector(&equal_blocks);
  crnlib::vector<unsigned_int>::~vector(&better_blocks);
  return;
}

Assistant:

void corpus_tester::print_comparative_metric_stats(const command_line_params& cmd_line_params, const crnlib::vector<image_utils::error_metrics>& stats1, const crnlib::vector<image_utils::error_metrics>& stats2, uint num_blocks_x, uint num_blocks_y)
    {
        num_blocks_y;

        crnlib::vector<uint> better_blocks;
        crnlib::vector<uint> equal_blocks;
        crnlib::vector<uint> worse_blocks;
        crnlib::vector<float> delta_psnr;

        for (uint i = 0; i < stats1.size(); i++)
        {
            //uint bx = i % num_blocks_x;
            //uint by = i / num_blocks_x;

            const image_utils::error_metrics& em1 = stats1[i];
            const image_utils::error_metrics& em2 = stats2[i];

            if (em1.mPeakSNR < em2.mPeakSNR)
            {
                worse_blocks.push_back(i);
                delta_psnr.push_back((float)(em2.mPeakSNR - em1.mPeakSNR));
            }
            else if (fabs(em1.mPeakSNR - em2.mPeakSNR) < .001f)
            {
                equal_blocks.push_back(i);
            }
            else
            {
                better_blocks.push_back(i);
            }
        }

        console::printf("Num worse blocks: %u, %3.3f%%", worse_blocks.size(), worse_blocks.size() * 100.0f / stats1.size());
        console::printf("Num equal blocks: %u, %3.3f%%", equal_blocks.size(), equal_blocks.size() * 100.0f / stats1.size());
        console::printf("Num better blocks: %u, %3.3f%%", better_blocks.size(), better_blocks.size() * 100.0f / stats1.size());
        console::printf("Num equal+better blocks: %u, %3.3f%%", equal_blocks.size() + better_blocks.size(), (equal_blocks.size() + better_blocks.size()) * 100.0f / stats1.size());

        if (!cmd_line_params.has_key("nobadblocks"))
        {
            crnlib::vector<uint> indices[2];
            indices[0].resize(worse_blocks.size());
            indices[1].resize(worse_blocks.size());

            uint* pSorted_indices = nullptr;
            if (worse_blocks.size())
            {
                pSorted_indices = indirect_radix_sort(worse_blocks.size(), &indices[0][0], &indices[1][0], &delta_psnr[0], 0, sizeof(float), true);

                console::printf("List of worse blocks sorted by delta PSNR:");
                for (uint i = 0; i < worse_blocks.size(); i++)
                {
                    uint block_index = worse_blocks[pSorted_indices[i]];
                    uint bx = block_index % num_blocks_x;
                    uint by = block_index / num_blocks_x;

                    console::printf("%u. [%u,%u] %3.3f %3.3f %3.3f",
                        i,
                        bx, by,
                        stats1[block_index].mPeakSNR,
                        stats2[block_index].mPeakSNR,
                        stats2[block_index].mPeakSNR - stats1[block_index].mPeakSNR);
                }
            }
        }
    }